

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_rightShift_ivec3(ShaderEvalContext *c)

{
  byte bVar1;
  int i;
  long lVar2;
  Vector<int,_3> res_1;
  Vector<int,_3> res;
  Vector<int,_3> result;
  Vector<float,_3> res_2;
  float local_30 [3];
  undefined8 local_24;
  float local_1c;
  int local_18 [6];
  
  local_30[0] = c->in[0].m_data[2];
  local_30[1] = c->in[0].m_data[0];
  local_30[2] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (int)local_30[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_24 = *(undefined8 *)(c->in[1].m_data + 1);
  local_1c = c->in[1].m_data[0];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = (int)*(float *)((long)&local_24 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  result.m_data[2] = 0;
  result.m_data[0] = 0;
  result.m_data[1] = 0;
  lVar2 = 0;
  do {
    bVar1 = (byte)res_1.m_data[lVar2];
    result.m_data[lVar2] =
         res.m_data[lVar2] >> 0x1f & ~(0xffffffffU >> (bVar1 & 0x1f)) |
         res.m_data[lVar2] >> (bVar1 & 0x1f);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (float)result.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[local_18[lVar2]] = (float)result.m_data[lVar2 + 2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }